

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O3

edata_t * duckdb_je_ecache_evict
                    (tsdn_t *tsdn,pac_t *pac,ehooks_t *ehooks,ecache_t *ecache,size_t npages_min)

{
  uint64_t *puVar1;
  witness_t **ppwVar2;
  eset_t *eset;
  pac_t *pac_00;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  edata_t *edata;
  mutex_prof_data_t *data;
  pthread_mutex_t *ppVar6;
  eset_t *eset_00;
  edata_t *edata_00;
  _Bool coalesced;
  _Bool local_59;
  pthread_mutex_t *local_58;
  pac_t *local_50;
  eset_t *local_48;
  ehooks_t *local_40;
  size_t local_38;
  
  ppVar6 = (pthread_mutex_t *)((long)&(ecache->mtx).field_0 + 0x48);
  local_50 = pac;
  local_40 = ehooks;
  local_38 = npages_min;
  iVar3 = pthread_mutex_trylock(ppVar6);
  if (iVar3 != 0) {
    duckdb_je_malloc_mutex_lock_slow(&ecache->mtx);
    (ecache->mtx).field_0.field_0.locked.repr = true;
  }
  puVar1 = &(ecache->mtx).field_0.field_0.prof_data.n_lock_ops;
  *puVar1 = *puVar1 + 1;
  if ((ecache->mtx).field_0.field_0.prof_data.prev_owner != tsdn) {
    (ecache->mtx).field_0.field_0.prof_data.prev_owner = tsdn;
    ppwVar2 = &(ecache->mtx).field_0.witness.link.qre_prev;
    *ppwVar2 = (witness_t *)((long)&(*ppwVar2)->name + 1);
  }
  eset = &ecache->eset;
  local_48 = &ecache->guarded_eset;
  local_58 = ppVar6;
  do {
    edata_00 = (ecache->eset).lru.head.qlh_first;
    eset_00 = eset;
    if (edata_00 == (edata_t *)0x0) {
      edata_00 = (ecache->guarded_eset).lru.head.qlh_first;
      eset_00 = local_48;
      if (edata_00 != (edata_t *)0x0) goto LAB_01d7181e;
LAB_01d718f8:
      edata_00 = (edata_t *)0x0;
      ppVar6 = local_58;
      goto LAB_01d71900;
    }
LAB_01d7181e:
    sVar4 = duckdb_je_eset_npages_get(eset);
    sVar5 = duckdb_je_eset_npages_get(local_48);
    if (sVar5 + sVar4 <= local_38) goto LAB_01d718f8;
    duckdb_je_eset_remove(eset_00,edata_00);
    pac_00 = local_50;
    if ((ecache->delay_coalesce != true) || ((edata_00->e_bits & 0x10000) != 0)) {
LAB_01d718c4:
      ppVar6 = local_58;
      if (ecache->state - extent_state_dirty < 2) {
        duckdb_je_emap_update_edata_state(tsdn,local_50->emap,edata_00,extent_state_active);
      }
      else {
        duckdb_je_emap_deregister_boundary(tsdn,local_50->emap,edata_00);
      }
LAB_01d71900:
      (ecache->mtx).field_0.field_0.locked.repr = false;
      pthread_mutex_unlock(ppVar6);
      return edata_00;
    }
    duckdb_je_emap_update_edata_state(tsdn,local_50->emap,edata_00,extent_state_active);
    edata = extent_try_coalesce_impl(tsdn,pac_00,local_40,ecache,edata_00,&local_59);
    duckdb_je_emap_update_edata_state(tsdn,pac_00->emap,edata,ecache->state);
    if (local_59 == false) goto LAB_01d718c4;
    duckdb_je_eset_insert(eset,edata);
  } while( true );
}

Assistant:

edata_t *
ecache_evict(tsdn_t *tsdn, pac_t *pac, ehooks_t *ehooks,
    ecache_t *ecache, size_t npages_min) {
	malloc_mutex_lock(tsdn, &ecache->mtx);

	/*
	 * Get the LRU coalesced extent, if any.  If coalescing was delayed,
	 * the loop will iterate until the LRU extent is fully coalesced.
	 */
	edata_t *edata;
	while (true) {
		/* Get the LRU extent, if any. */
		eset_t *eset = &ecache->eset;
		edata = edata_list_inactive_first(&eset->lru);
		if (edata == NULL) {
			/*
			 * Next check if there are guarded extents.  They are
			 * more expensive to purge (since they are not
			 * mergeable), thus in favor of caching them longer.
			 */
			eset = &ecache->guarded_eset;
			edata = edata_list_inactive_first(&eset->lru);
			if (edata == NULL) {
				goto label_return;
			}
		}
		/* Check the eviction limit. */
		size_t extents_npages = ecache_npages_get(ecache);
		if (extents_npages <= npages_min) {
			edata = NULL;
			goto label_return;
		}
		eset_remove(eset, edata);
		if (!ecache->delay_coalesce || edata_guarded_get(edata)) {
			break;
		}
		/* Try to coalesce. */
		if (extent_try_delayed_coalesce(tsdn, pac, ehooks, ecache,
		    edata)) {
			break;
		}
		/*
		 * The LRU extent was just coalesced and the result placed in
		 * the LRU at its neighbor's position.  Start over.
		 */
	}

	/*
	 * Either mark the extent active or deregister it to protect against
	 * concurrent operations.
	 */
	switch (ecache->state) {
	case extent_state_dirty:
	case extent_state_muzzy:
		emap_update_edata_state(tsdn, pac->emap, edata,
		    extent_state_active);
		break;
	case extent_state_retained:
		extent_deregister(tsdn, pac, edata);
		break;
	case extent_state_active:
	case extent_state_transition:
	case extent_state_merging:
	default:
		not_reached();
	}

label_return:
	malloc_mutex_unlock(tsdn, &ecache->mtx);
	return edata;
}